

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

array_container_t * array_container_from_bitset(bitset_container_t *bits)

{
  array_container_t *paVar1;
  
  paVar1 = array_container_create_given_capacity(bits->cardinality);
  paVar1->cardinality = bits->cardinality;
  bitset_extract_setbits_uint16(bits->words,0x400,paVar1->array,0);
  return paVar1;
}

Assistant:

array_container_t *array_container_from_bitset(const bitset_container_t *bits) {
    array_container_t *result =
        array_container_create_given_capacity(bits->cardinality);
    result->cardinality = bits->cardinality;
    //  sse version ends up being slower here
    // (bitset_extract_setbits_sse_uint16)
    // because of the sparsity of the data
    bitset_extract_setbits_uint16(bits->words, BITSET_CONTAINER_SIZE_IN_WORDS,
                                  result->array, 0);
    return result;
}